

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall
amrex::StateData::getData
          (StateData *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *data,
          Vector<double,_std::allocator<double>_> *datatime,Real time)

{
  pointer *pppMVar1;
  TimeInterval *__args;
  double dVar2;
  double dVar3;
  pointer ppMVar4;
  pointer pdVar5;
  TimeCenter TVar6;
  double *pdVar7;
  TimeInterval *__args_00;
  iterator iVar8;
  iterator iVar9;
  double dVar10;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_40;
  TimeInterval local_38;
  
  ppMVar4 = (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppMVar4) {
    (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppMVar4;
  }
  pdVar5 = (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((datatime->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
      != pdVar5) {
    (datatime->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
         pdVar5;
  }
  local_38.start = time;
  local_38.stop = time;
  TVar6 = StateDescriptor::timeType(this->desc);
  if (TVar6 == Point) {
    local_40._M_head_impl =
         (this->old_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (local_40._M_head_impl == (MultiFab *)0x0) {
      local_40._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      iVar8._M_current =
           (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_realloc_insert<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar8,
                   &local_40._M_head_impl);
      }
      else {
        *iVar8._M_current = local_40._M_head_impl;
        pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      iVar9._M_current =
           (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      __args_00 = &this->new_time;
      if (iVar9._M_current !=
          (datatime->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        local_38.start = (this->new_time).start;
        goto LAB_004d07a1;
      }
      goto LAB_004d07b5;
    }
    __args_00 = &this->new_time;
    dVar2 = (this->new_time).start;
    dVar3 = (this->old_time).start;
    dVar10 = (dVar2 - dVar3) * 0.001;
    if ((local_38.stop <= dVar2 - dVar10) || (dVar2 + dVar10 <= local_38.stop)) {
      __args = &this->old_time;
      if ((dVar3 - dVar10 < local_38.stop) && (local_38.stop < dVar3 + dVar10)) {
        iVar8._M_current =
             (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
          _M_realloc_insert<amrex::MultiFab*>
                    ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar8,
                     &local_40._M_head_impl);
        }
        else {
          *iVar8._M_current = local_40._M_head_impl;
          pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        iVar9._M_current =
             (datatime->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        __args_00 = __args;
        if (iVar9._M_current !=
            (datatime->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          local_38.start = __args->start;
          goto LAB_004d07a1;
        }
LAB_004d07b5:
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)datatime,iVar9,&__args_00->start);
        return;
      }
      iVar8._M_current =
           (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_realloc_insert<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar8,
                   &local_40._M_head_impl);
        iVar8._M_current =
             (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar8._M_current = local_40._M_head_impl;
        iVar8._M_current =
             (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
        (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current;
      }
      local_40._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if (iVar8._M_current ==
          (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_realloc_insert<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar8,
                   &local_40._M_head_impl);
      }
      else {
        *iVar8._M_current = local_40._M_head_impl;
        pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      iVar9._M_current =
           (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      pdVar7 = (datatime->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      if (iVar9._M_current == pdVar7) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)datatime,iVar9,&__args->start);
        iVar9._M_current =
             (datatime->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        pdVar7 = (datatime->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
      }
      else {
        *iVar9._M_current = __args->start;
        iVar9._M_current = iVar9._M_current + 1;
        (datatime->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar9._M_current;
      }
      if (iVar9._M_current == pdVar7) goto LAB_004d07b5;
    }
    else {
      local_40._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      iVar8._M_current =
           (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
        _M_realloc_insert<amrex::MultiFab*>
                  ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar8,
                   &local_40._M_head_impl);
      }
      else {
        *iVar8._M_current = local_40._M_head_impl;
        pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      iVar9._M_current =
           (datatime->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar9._M_current ==
          (datatime->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_004d07b5;
    }
    local_38.start = __args_00->start;
  }
  else {
    dVar2 = (this->new_time).start;
    dVar3 = (this->old_time).start;
    dVar10 = (dVar2 - dVar3) * 0.001;
    if ((local_38.stop <= dVar2 - dVar10) || ((this->new_time).stop + dVar10 <= local_38.stop)) {
      local_40._M_head_impl =
           (this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if ((local_38.stop <= dVar3 - dVar10 || local_40._M_head_impl == (MultiFab *)0x0) ||
         (dVar10 + (this->old_time).stop <= local_38.stop)) {
        Error_host("StateData::getData(): how did we get here?");
        return;
      }
    }
    else {
      local_40._M_head_impl =
           (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    }
    iVar8._M_current =
         (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      _M_realloc_insert<amrex::MultiFab*>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)data,iVar8,
                 &local_40._M_head_impl);
    }
    else {
      *iVar8._M_current = local_40._M_head_impl;
      pppMVar1 = &(data->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
    iVar9._M_current =
         (datatime->super_vector<double,_std::allocator<double>_>).
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar9._M_current ==
        (datatime->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      __args_00 = &local_38;
      goto LAB_004d07b5;
    }
  }
LAB_004d07a1:
  *iVar9._M_current = local_38.start;
  (datatime->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       iVar9._M_current + 1;
  return;
}

Assistant:

void
StateData::getData (Vector<MultiFab*>& data,
                    Vector<Real>& datatime,
                    Real time) const
{
    data.clear();
    datatime.clear();

    if (desc->timeType() == StateDescriptor::Point)
    {
        BL_ASSERT(new_data != nullptr);
        if (old_data == nullptr)
        {
            data.push_back(new_data.get());
            datatime.push_back(new_time.start);
        }
        else
        {
            const Real teps = (new_time.start - old_time.start)*1.e-3_rt;
            if (time > new_time.start-teps && time < new_time.start+teps) {
                data.push_back(new_data.get());
                datatime.push_back(new_time.start);
            } else if (time > old_time.start-teps && time < old_time.start+teps) {
                data.push_back(old_data.get());
                datatime.push_back(old_time.start);
            } else {
                data.push_back(old_data.get());
                data.push_back(new_data.get());
                datatime.push_back(old_time.start);
                datatime.push_back(new_time.start);
            }
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            data.push_back(new_data.get());
            datatime.push_back(time);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            data.push_back(old_data.get());
            datatime.push_back(time);
        }
        else
        {
            amrex::Error("StateData::getData(): how did we get here?");
        }
    }
}